

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

mcu8str * mctools_expand_path(mcu8str *__return_storage_ptr__,mcu8str *praw)

{
  char *pcVar1;
  int iVar2;
  char *c_str;
  mcu8str *pmVar3;
  mcu8str *path;
  char *__return_storage_ptr___00;
  uint uVar4;
  char *pcVar5;
  mcu8str p;
  mcu8str mStack_a0;
  mcu8str mStack_88;
  mcu8str *pmStack_70;
  char *pcStack_68;
  code *pcStack_60;
  mcu8str local_50;
  mcu8str local_38;
  
  pcVar5 = praw->c_str;
  uVar4 = praw->size;
  local_50.buflen = uVar4 + 1;
  local_50.owns_memory = 0;
  pcStack_60 = (code *)0x1080fe;
  local_50.c_str = pcVar5;
  local_50.size = uVar4;
  iVar2 = mctools_impl_has_winnamespace(praw);
  if (iVar2 != 0) {
    pcVar5 = pcVar5 + 4;
    uVar4 = uVar4 - 4;
    local_50.c_str = pcVar5;
    local_50.size = uVar4;
  }
  if (uVar4 == 0) {
    __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
    __return_storage_ptr__->size = 0;
    __return_storage_ptr__->buflen = 0;
    __return_storage_ptr__->owns_memory = 0;
    return __return_storage_ptr__;
  }
  local_38.owns_memory = 0;
  local_38.size = 0;
  local_38.buflen = 0;
  if (((uVar4 != 1) && (*pcVar5 == '~')) && ((pcVar5[1] == '\\' || (pcVar5[1] == '/')))) {
    pcStack_60 = (code *)0x10815d;
    c_str = getenv("HOME");
    if (c_str != (char *)0x0) {
      if (uVar4 == 2) {
        pcStack_60 = (code *)0x10817a;
        mcu8str_create_from_cstr(__return_storage_ptr__,c_str);
        pcStack_60 = (code *)0x108182;
        mctools_pathseps_platform(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      pcStack_60 = (code *)0x1081ac;
      pmVar3 = (mcu8str *)mctools_strlen(c_str,0);
      path = (mcu8str *)((long)&pmVar3->c_str + (long)&((mcu8str *)(ulong)uVar4)[-1].field_0x17);
      if ((path <= pmVar3) || (path <= (mcu8str *)(ulong)uVar4)) {
        __return_storage_ptr___00 = "string length overflow in mctools_expand_path";
        pcStack_60 = mctools_absolute_path;
        mctools_impl_error("string length overflow in mctools_expand_path");
        pcVar1 = path->c_str;
        uVar4 = path->size;
        mStack_a0.buflen = uVar4 + 1;
        mStack_a0.owns_memory = 0;
        mStack_a0.c_str = pcVar1;
        mStack_a0.size = uVar4;
        pmStack_70 = __return_storage_ptr__;
        pcStack_68 = pcVar5;
        pcStack_60 = (code *)c_str;
        iVar2 = mctools_impl_has_winnamespace(path);
        if (iVar2 != 0) {
          mStack_a0.c_str = pcVar1 + 4;
          uVar4 = uVar4 - 4;
          mStack_a0.size = uVar4;
        }
        ((mcu8str *)__return_storage_ptr___00)->c_str = mcu8str_create_empty::dummy;
        ((mcu8str *)__return_storage_ptr___00)->size = 0;
        ((mcu8str *)__return_storage_ptr___00)->buflen = 0;
        ((mcu8str *)__return_storage_ptr___00)->owns_memory = 0;
        if (uVar4 != 0) {
          iVar2 = mctools_path_is_absolute(&mStack_a0);
          if (iVar2 == 0) {
            mctools_get_current_working_dir();
            mctools_path_join((mcu8str *)__return_storage_ptr___00,&mStack_88,&mStack_a0);
            if ((mStack_88.owns_memory != 0) && (mStack_88.c_str != (char *)0x0)) {
              free(mStack_88.c_str);
            }
          }
          else {
            mcu8str_copy((mcu8str *)__return_storage_ptr___00,&mStack_a0);
          }
          mctools_pathseps_platform((mcu8str *)__return_storage_ptr___00);
        }
        return (mcu8str *)__return_storage_ptr___00;
      }
      pcStack_60 = (code *)0x1081d0;
      mcu8str_create(&local_38,(mcu8str_size_t)path);
      pcStack_60 = (code *)0x1081db;
      mcu8str_append_cstr(&local_38,c_str);
      pcStack_60 = (code *)0x1081e6;
      mcu8str_append_cstr(&local_38,pcVar5 + 1);
      if (local_38.size != 0) goto LAB_001081fd;
    }
  }
  pcStack_60 = (code *)0x1081fd;
  mcu8str_copy(&local_38,&local_50);
LAB_001081fd:
  pcStack_60 = (code *)0x10820a;
  mctools_pathseps_platform(&local_38);
  *(ulong *)&__return_storage_ptr__->owns_memory = CONCAT44(local_38._20_4_,local_38.owns_memory);
  __return_storage_ptr__->c_str = local_38.c_str;
  __return_storage_ptr__->size = local_38.size;
  __return_storage_ptr__->buflen = local_38.buflen;
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_expand_path( const mcu8str* praw )
  {
    mcu8str p = mctools_impl_view_no_winnamespace(praw);
    if ( p.size == 0 )
      return mcu8str_create_empty();
    mcu8str res;
    res.owns_memory = 0;
    res.size = 0;
    res.buflen = 0;
#ifdef MC_IS_WINDOWS
    mcwinstr wp = mc_path2longwpath( &p );
    res = mc_winstr_to_u8str(&wp);
    mc_winstr_dealloc(&wp);
#else
    if ( p.size >= 2
         && p.c_str[0] == '~'
         && ( p.c_str[1] == '/' || p.c_str[1] == '\\' ) ) {
      const char * home = getenv("HOME");
      if ( home ) {
        if ( p.size == 2 ) {
          mcu8str rhome = mcu8str_create_from_cstr(home);
          mctools_pathseps_platform(&rhome);
          return rhome;
        }
        const mcu8str_size_t home_size = mctools_strlen( home, 0 );
        const mcu8str_size_t newsize = (mcu8str_size_t)(home_size + p.size - 1);
        if ( ( newsize + 1 != (mcu8str_size_t)(home_size + p.size) )
             || newsize <= home_size || newsize <= p.size )
          mctools_impl_error("string length overflow in mctools_expand_path");
        res = mcu8str_create( newsize );
        mcu8str_append_cstr(&res,home);
        mcu8str_append_cstr(&res, p.c_str + 1 );
      }
    }
    if ( res.size == 0 )
      res = mcu8str_copy( &p );
#endif
    mctools_pathseps_platform(&res);
    return res;
  }